

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

void rehash(st_table *table)

{
  int iVar1;
  st_table_entry *psVar2;
  uint uVar3;
  st_table_entry **ppsVar4;
  uint uVar5;
  uint hash_val;
  int old_num_bins;
  int new_num_bins;
  int i;
  st_table_entry **new_bins;
  st_table_entry *next;
  st_table_entry *ptr;
  st_table *table_local;
  
  iVar1 = table->num_bins;
  uVar3 = new_size(iVar1 + 1);
  if ((0 < (int)uVar3) &&
     (ppsVar4 = (st_table_entry **)calloc((long)(int)uVar3,8), ppsVar4 != (st_table_entry **)0x0)) {
    for (old_num_bins = 0; old_num_bins < iVar1; old_num_bins = old_num_bins + 1) {
      next = table->bins[old_num_bins];
      while (next != (st_table_entry *)0x0) {
        psVar2 = next->next;
        uVar5 = next->hash % uVar3;
        next->next = ppsVar4[uVar5];
        ppsVar4[uVar5] = next;
        next = psVar2;
      }
    }
    free(table->bins);
    table->num_bins = uVar3;
    table->bins = ppsVar4;
  }
  return;
}

Assistant:

static void
rehash(register st_table* table)
{
  register st_table_entry *ptr, *next, **new_bins;
  int i, new_num_bins, old_num_bins;
  unsigned int hash_val;

  old_num_bins = table->num_bins;
  new_num_bins = new_size(old_num_bins + 1);
  if (new_num_bins <= 0) return ;

  new_bins = (st_table_entry**)Calloc(new_num_bins, sizeof(st_table_entry*));
  if (new_bins == 0) {
    return ;
  }

  for(i = 0; i < old_num_bins; i++) {
    ptr = table->bins[i];
    while (ptr != 0) {
	    next = ptr->next;
	    hash_val = ptr->hash % new_num_bins;
	    ptr->next = new_bins[hash_val];
	    new_bins[hash_val] = ptr;
	    ptr = next;
    }
  }
  free(table->bins);
  table->num_bins = new_num_bins;
  table->bins = new_bins;
}